

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_common.cc
# Opt level: O0

void google::protobuf::compiler::java::SetCommonOneofVariables
               (FieldDescriptor *descriptor,OneofGeneratorInfo *info,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  int iVar1;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar2;
  OneofDescriptor *this;
  char *pcVar3;
  AlphaNum *this_00;
  int __c;
  AlphaNum *a;
  FieldDescriptor *field;
  string *__s;
  AlphaNum *in_R8;
  AlphaNum local_280;
  AlphaNum local_250;
  AlphaNum local_220;
  string local_1f0;
  AlphaNum local_1d0;
  AlphaNum local_1a0;
  string local_170;
  AlphaNum local_150;
  AlphaNum local_120;
  AlphaNum local_f0;
  string local_c0;
  string local_a0;
  AlphaNum local_70;
  string local_40;
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *local_20;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  OneofGeneratorInfo *info_local;
  FieldDescriptor *descriptor_local;
  
  local_20 = (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)variables;
  variables_local =
       (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)info;
  info_local = (OneofGeneratorInfo *)descriptor;
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[11]> *)0xa82482);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)info);
  __s = (string *)(variables_local + 1);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[23]> *)"oneof_capitalized_name");
  std::__cxx11::string::operator=((string *)pbVar2,__s);
  this = FieldDescriptor::containing_oneof((FieldDescriptor *)info_local);
  pcVar3 = OneofDescriptor::index(this,(char *)__s,__c);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_70,(int)pcVar3);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_40,(lts_20250127 *)&local_70,a);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[12]> *)"oneof_index");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  GetOneofStoredType_abi_cxx11_(&local_a0,(java *)info_local,field);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[18],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[18]> *)"oneof_stored_type");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)variables_local);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_120,"Case_ = ");
  iVar1 = FieldDescriptor::number((FieldDescriptor *)info_local);
  this_00 = &local_150;
  absl::lts_20250127::AlphaNum::AlphaNum(this_00,iVar1);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_c0,(lts_20250127 *)&local_f0,&local_120,this_00,in_R8);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[23]> *)"set_oneof_case_message");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_1a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)variables_local);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1d0,"Case_ = 0");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_170,(lts_20250127 *)&local_1a0,&local_1d0,this_00);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[25]> *)"clear_oneof_case_message");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)variables_local);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_250,"Case_ == ");
  iVar1 = FieldDescriptor::number((FieldDescriptor *)info_local);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_280,iVar1);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1f0,(lts_20250127 *)&local_220,&local_250,&local_280,in_R8);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[23]> *)"has_oneof_case_message");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

void SetCommonOneofVariables(
    const FieldDescriptor* descriptor, const OneofGeneratorInfo* info,
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)["oneof_name"] = info->name;
  (*variables)["oneof_capitalized_name"] = info->capitalized_name;
  (*variables)["oneof_index"] =
      absl::StrCat(descriptor->containing_oneof()->index());
  (*variables)["oneof_stored_type"] = GetOneofStoredType(descriptor);
  (*variables)["set_oneof_case_message"] =
      absl::StrCat(info->name, "Case_ = ", descriptor->number());
  (*variables)["clear_oneof_case_message"] =
      absl::StrCat(info->name, "Case_ = 0");
  (*variables)["has_oneof_case_message"] =
      absl::StrCat(info->name, "Case_ == ", descriptor->number());
}